

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

uint64_t roaring_bitmap_get_cardinality(roaring_bitmap_t *r)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  run_container_t *run;
  uint64_t uVar4;
  long lVar5;
  
  iVar3 = (r->high_low_container).size;
  if (iVar3 < 1) {
    uVar4 = 0;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    do {
      run = (run_container_t *)(r->high_low_container).containers[lVar5];
      uVar1 = (r->high_low_container).typecodes[lVar5];
      if (uVar1 == '\x04') {
        uVar1 = *(uint8_t *)&run->runs;
        run = *(run_container_t **)run;
      }
      if (uVar1 == '\x03') {
        iVar2 = run_container_cardinality(run);
        iVar3 = (r->high_low_container).size;
      }
      else {
        iVar2 = run->n_runs;
      }
      uVar4 = uVar4 + (long)iVar2;
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar3);
  }
  return uVar4;
}

Assistant:

uint64_t roaring_bitmap_get_cardinality(const roaring_bitmap_t *r) {
    const roaring_array_t *ra = &r->high_low_container;

    uint64_t card = 0;
    for (int i = 0; i < ra->size; ++i)
        card += container_get_cardinality(ra->containers[i], ra->typecodes[i]);
    return card;
}